

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void ly_log_dbg(uint32_t group,char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  atomic_uint_fast32_t local_50;
  undefined1 local_48 [8];
  va_list ap;
  char *local_28;
  char *str_group;
  char *dbg_format;
  char *format_local;
  uint32_t group_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_50 = ly_ldbg_groups;
  if ((ly_ldbg_groups & group) != 0) {
    local_f8 = in_RDX;
    local_f0 = in_RCX;
    local_e8 = in_R8;
    local_e0 = in_R9;
    dbg_format = format;
    format_local._4_4_ = group;
    if (group == 1) {
      local_28 = "DICT";
    }
    else if (group == 2) {
      local_28 = "XPATH";
    }
    else {
      if (group != 4) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/log.c",0x2ae)
        ;
        return;
      }
      local_28 = "DEPSETS";
    }
    iVar1 = asprintf(&str_group,"%s: %s",local_28,format);
    if (iVar1 == -1) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_log_dbg");
    }
    else {
      ap[0].overflow_arg_area = local_108;
      ap[0]._0_8_ = &stack0x00000008;
      local_48._4_4_ = 0x30;
      local_48._0_4_ = 0x10;
      log_vprintf((ly_ctx *)0x0,LY_LLDBG,LY_SUCCESS,LYVE_SUCCESS,(char *)0x0,(char *)0x0,0,
                  (char *)0x0,str_group,(__va_list_tag *)local_48);
      free(str_group);
    }
  }
  return;
}

Assistant:

void
ly_log_dbg(uint32_t group, const char *format, ...)
{
    char *dbg_format;
    const char *str_group;
    va_list ap;

    if (!(ATOMIC_LOAD_RELAXED(ly_ldbg_groups) & group)) {
        return;
    }

    switch (group) {
    case LY_LDGDICT:
        str_group = "DICT";
        break;
    case LY_LDGXPATH:
        str_group = "XPATH";
        break;
    case LY_LDGDEPSETS:
        str_group = "DEPSETS";
        break;
    default:
        LOGINT(NULL);
        return;
    }

    if (asprintf(&dbg_format, "%s: %s", str_group, format) == -1) {
        LOGMEM(NULL);
        return;
    }

    va_start(ap, format);
    log_vprintf(NULL, LY_LLDBG, 0, 0, NULL, NULL, 0, NULL, dbg_format, ap);
    va_end(ap);

    free(dbg_format);
}